

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O1

void g_ptr_array_insert(GPtrArray *array,gint index_,gpointer data)

{
  uint uVar1;
  
  g_ptr_array_maybe_expand((GRealPtrArray *)array,1);
  if (index_ < 0) {
    index_ = array->len;
  }
  uVar1 = array->len - index_;
  if ((uint)index_ <= array->len && uVar1 != 0) {
    memmove(array->pdata + (long)index_ + 1,array->pdata + index_,(ulong)uVar1 << 3);
  }
  array->len = array->len + 1;
  array->pdata[index_] = data;
  return;
}

Assistant:

void g_ptr_array_insert (GPtrArray *array, gint index_, gpointer data)
{
    GRealPtrArray *rarray = (GRealPtrArray *)array;

    g_return_if_fail (rarray);
    g_return_if_fail (index_ >= -1);
    g_return_if_fail (index_ <= (gint)rarray->len);

    g_ptr_array_maybe_expand (rarray, 1);

    if (index_ < 0)
        index_ = rarray->len;

    if ((guint) index_ < rarray->len)
        memmove (&(rarray->pdata[index_ + 1]),
                &(rarray->pdata[index_]),
                (rarray->len - index_) * sizeof (gpointer));

    rarray->len++;
    rarray->pdata[index_] = data;
}